

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx512::
     BVHNIntersectorKHybrid<8,_4,_16777232,_true,_embree::avx512::ArrayIntersectorK_1<4,_embree::avx512::TriangleMvMBIntersectorKPluecker<4,_4,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  int iVar1;
  undefined4 uVar2;
  Scene *pSVar3;
  Geometry *pGVar4;
  RTCFilterFunctionN p_Var5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined8 uVar13;
  ulong uVar14;
  ulong uVar15;
  undefined8 uVar16;
  byte bVar17;
  int iVar18;
  int iVar19;
  StackItemT<embree::NodeRefPtr<8>_> *pSVar20;
  byte bVar21;
  AABBNodeMB4D *node1;
  undefined1 (*pauVar22) [32];
  long lVar23;
  byte bVar24;
  uint uVar25;
  uint uVar26;
  ulong uVar27;
  uint uVar28;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  ulong uVar29;
  size_t sVar30;
  ulong uVar31;
  bool bVar32;
  uint uVar33;
  ulong uVar34;
  ulong uVar35;
  undefined1 auVar59 [16];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [64];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined4 uVar73;
  float fVar74;
  float fVar76;
  float fVar77;
  float fVar78;
  undefined1 auVar75 [16];
  float fVar79;
  float fVar80;
  float fVar81;
  float fVar82;
  float fVar83;
  float fVar84;
  float fVar85;
  float fVar86;
  float fVar87;
  float fVar88;
  float fVar89;
  float fVar90;
  float fVar91;
  float fVar92;
  float fVar93;
  float fVar94;
  float fVar95;
  undefined1 auVar96 [64];
  undefined1 auVar97 [64];
  undefined1 auVar98 [64];
  undefined1 auVar99 [64];
  undefined1 auVar100 [64];
  undefined1 auVar101 [64];
  undefined1 auVar102 [64];
  undefined1 auVar103 [64];
  undefined1 auVar104 [64];
  long lStack_26c0;
  StackItemT<embree::NodeRefPtr<8>_> *local_26b0;
  undefined1 local_2668 [16];
  long local_2658;
  long local_2650;
  RTCFilterFunctionNArguments args;
  undefined1 local_25b8 [16];
  undefined1 local_25a8 [16];
  undefined1 local_2598 [16];
  undefined1 local_2588 [16];
  undefined1 local_2578 [16];
  float local_2568 [4];
  undefined1 local_2558 [32];
  undefined1 local_2538 [32];
  undefined1 local_2518 [32];
  undefined1 local_24f8 [32];
  undefined1 local_24d8 [32];
  undefined1 local_24b8 [32];
  undefined1 local_2498 [16];
  RTCHitN local_2488 [16];
  undefined1 local_2478 [16];
  undefined1 local_2468 [16];
  undefined1 local_2458 [16];
  undefined4 local_2448;
  undefined4 uStack_2444;
  undefined4 uStack_2440;
  undefined4 uStack_243c;
  undefined1 local_2438 [16];
  undefined1 local_2428 [16];
  uint local_2418;
  uint uStack_2414;
  uint uStack_2410;
  uint uStack_240c;
  uint uStack_2408;
  uint uStack_2404;
  uint uStack_2400;
  uint uStack_23fc;
  undefined1 local_23f8 [32];
  float local_23d8;
  float fStack_23d4;
  float fStack_23d0;
  float fStack_23cc;
  float fStack_23c8;
  float fStack_23c4;
  float fStack_23c0;
  float fStack_23bc;
  float local_23b8;
  float fStack_23b4;
  float fStack_23b0;
  float fStack_23ac;
  float fStack_23a8;
  float fStack_23a4;
  float fStack_23a0;
  float fStack_239c;
  float local_2398;
  float fStack_2394;
  float fStack_2390;
  float fStack_238c;
  float fStack_2388;
  float fStack_2384;
  float fStack_2380;
  float fStack_237c;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  
  local_26b0 = stack + 1;
  stack[0].ptr.ptr = root.ptr;
  stack[0].dist = 0;
  local_24b8 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4)));
  auVar99 = ZEXT3264(local_24b8);
  local_24d8 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x10)));
  auVar100 = ZEXT3264(local_24d8);
  local_24f8 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x20)));
  auVar101 = ZEXT3264(local_24f8);
  fVar74 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar82 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar89 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  local_2518 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar74 * 0.99999964)));
  auVar102 = ZEXT3264(local_2518);
  local_2538 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar82 * 0.99999964)));
  auVar103 = ZEXT3264(local_2538);
  local_2558 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar89 * 0.99999964)));
  auVar104 = ZEXT3264(local_2558);
  fVar74 = fVar74 * 1.0000004;
  fVar82 = fVar82 * 1.0000004;
  fVar89 = fVar89 * 1.0000004;
  uVar29 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar27 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar31 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  iVar1 = (tray->tnear).field_0.i[k];
  local_23f8._4_4_ = iVar1;
  local_23f8._0_4_ = iVar1;
  local_23f8._8_4_ = iVar1;
  local_23f8._12_4_ = iVar1;
  local_23f8._16_4_ = iVar1;
  local_23f8._20_4_ = iVar1;
  local_23f8._24_4_ = iVar1;
  local_23f8._28_4_ = iVar1;
  auVar96 = ZEXT3264(local_23f8);
  iVar1 = (tray->tfar).field_0.i[k];
  auVar70 = ZEXT3264(CONCAT428(iVar1,CONCAT424(iVar1,CONCAT420(iVar1,CONCAT416(iVar1,CONCAT412(iVar1
                                                  ,CONCAT48(iVar1,CONCAT44(iVar1,iVar1))))))));
  local_2498 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  auVar60 = vpmovsxbd_avx2(ZEXT816(0x706050403020100));
  auVar97 = ZEXT3264(auVar60);
  auVar98 = ZEXT3264(CONCAT428(0xfffffff8,
                               CONCAT424(0xfffffff8,
                                         CONCAT420(0xfffffff8,
                                                   CONCAT416(0xfffffff8,
                                                             CONCAT412(0xfffffff8,
                                                                       CONCAT48(0xfffffff8,
                                                                                0xfffffff8fffffff8))
                                                            )))));
  local_2398 = fVar74;
  fStack_2394 = fVar74;
  fStack_2390 = fVar74;
  fStack_238c = fVar74;
  fStack_2388 = fVar74;
  fStack_2384 = fVar74;
  fStack_2380 = fVar74;
  fStack_237c = fVar74;
  local_23b8 = fVar82;
  fStack_23b4 = fVar82;
  fStack_23b0 = fVar82;
  fStack_23ac = fVar82;
  fStack_23a8 = fVar82;
  fStack_23a4 = fVar82;
  fStack_23a0 = fVar82;
  fStack_239c = fVar82;
  local_23d8 = fVar89;
  fStack_23d4 = fVar89;
  fStack_23d0 = fVar89;
  fStack_23cc = fVar89;
  fStack_23c8 = fVar89;
  fStack_23c4 = fVar89;
  fStack_23c0 = fVar89;
  fStack_23bc = fVar89;
  fVar76 = fVar74;
  fVar77 = fVar74;
  fVar78 = fVar74;
  fVar79 = fVar74;
  fVar80 = fVar74;
  fVar81 = fVar74;
  fVar83 = fVar82;
  fVar84 = fVar82;
  fVar85 = fVar82;
  fVar86 = fVar82;
  fVar87 = fVar82;
  fVar88 = fVar82;
  fVar90 = fVar89;
  fVar91 = fVar89;
  fVar92 = fVar89;
  fVar93 = fVar89;
  fVar94 = fVar89;
  fVar95 = fVar89;
LAB_01da00c5:
  do {
    if (local_26b0 == stack) {
      return;
    }
    pSVar20 = local_26b0 + -1;
    local_26b0 = local_26b0 + -1;
  } while (*(float *)(ray + k * 4 + 0x80) < (float)pSVar20->dist);
  sVar30 = (local_26b0->ptr).ptr;
LAB_01da00fb:
  do {
    if ((sVar30 & 8) != 0) break;
    pauVar22 = (undefined1 (*) [32])(sVar30 & 0xfffffffffffffff0);
    uVar73 = *(undefined4 *)(ray + k * 4 + 0x70);
    auVar65._4_4_ = uVar73;
    auVar65._0_4_ = uVar73;
    auVar65._8_4_ = uVar73;
    auVar65._12_4_ = uVar73;
    auVar65._16_4_ = uVar73;
    auVar65._20_4_ = uVar73;
    auVar65._24_4_ = uVar73;
    auVar65._28_4_ = uVar73;
    auVar58 = vfmadd213ps_fma(*(undefined1 (*) [32])(pauVar22[8] + uVar29),auVar65,
                              *(undefined1 (*) [32])(pauVar22[2] + uVar29));
    auVar60 = vsubps_avx512vl(ZEXT1632(auVar58),auVar99._0_32_);
    auVar60 = vmulps_avx512vl(auVar102._0_32_,auVar60);
    auVar60 = vmaxps_avx(auVar96._0_32_,auVar60);
    auVar58 = vfmadd213ps_fma(*(undefined1 (*) [32])(pauVar22[8] + uVar27),auVar65,
                              *(undefined1 (*) [32])(pauVar22[2] + uVar27));
    auVar61 = vsubps_avx512vl(ZEXT1632(auVar58),auVar100._0_32_);
    auVar61 = vmulps_avx512vl(auVar103._0_32_,auVar61);
    auVar58 = vfmadd213ps_fma(*(undefined1 (*) [32])(pauVar22[8] + uVar31),auVar65,
                              *(undefined1 (*) [32])(pauVar22[2] + uVar31));
    auVar62 = vsubps_avx512vl(ZEXT1632(auVar58),auVar101._0_32_);
    auVar62 = vmulps_avx512vl(auVar104._0_32_,auVar62);
    auVar61 = vmaxps_avx(auVar61,auVar62);
    auVar60 = vmaxps_avx(auVar60,auVar61);
    auVar58 = vfmadd213ps_fma(*(undefined1 (*) [32])(pauVar22[8] + (uVar29 ^ 0x20)),auVar65,
                              *(undefined1 (*) [32])(pauVar22[2] + (uVar29 ^ 0x20)));
    auVar62 = vsubps_avx512vl(ZEXT1632(auVar58),auVar99._0_32_);
    auVar61._4_4_ = fVar76 * auVar62._4_4_;
    auVar61._0_4_ = fVar74 * auVar62._0_4_;
    auVar61._8_4_ = fVar77 * auVar62._8_4_;
    auVar61._12_4_ = fVar78 * auVar62._12_4_;
    auVar61._16_4_ = fVar79 * auVar62._16_4_;
    auVar61._20_4_ = fVar80 * auVar62._20_4_;
    auVar61._24_4_ = fVar81 * auVar62._24_4_;
    auVar61._28_4_ = auVar62._28_4_;
    auVar61 = vminps_avx(auVar70._0_32_,auVar61);
    auVar58 = vfmadd213ps_fma(*(undefined1 (*) [32])(pauVar22[8] + (uVar27 ^ 0x20)),auVar65,
                              *(undefined1 (*) [32])(pauVar22[2] + (uVar27 ^ 0x20)));
    auVar63 = vsubps_avx512vl(ZEXT1632(auVar58),auVar100._0_32_);
    auVar62._4_4_ = fVar83 * auVar63._4_4_;
    auVar62._0_4_ = fVar82 * auVar63._0_4_;
    auVar62._8_4_ = fVar84 * auVar63._8_4_;
    auVar62._12_4_ = fVar85 * auVar63._12_4_;
    auVar62._16_4_ = fVar86 * auVar63._16_4_;
    auVar62._20_4_ = fVar87 * auVar63._20_4_;
    auVar62._24_4_ = fVar88 * auVar63._24_4_;
    auVar62._28_4_ = auVar63._28_4_;
    auVar58 = vfmadd213ps_fma(*(undefined1 (*) [32])(pauVar22[8] + (uVar31 ^ 0x20)),auVar65,
                              *(undefined1 (*) [32])(pauVar22[2] + (uVar31 ^ 0x20)));
    auVar64 = vsubps_avx512vl(ZEXT1632(auVar58),auVar101._0_32_);
    auVar63._4_4_ = fVar90 * auVar64._4_4_;
    auVar63._0_4_ = fVar89 * auVar64._0_4_;
    auVar63._8_4_ = fVar91 * auVar64._8_4_;
    auVar63._12_4_ = fVar92 * auVar64._12_4_;
    auVar63._16_4_ = fVar93 * auVar64._16_4_;
    auVar63._20_4_ = fVar94 * auVar64._20_4_;
    auVar63._24_4_ = fVar95 * auVar64._24_4_;
    auVar63._28_4_ = auVar64._28_4_;
    auVar62 = vminps_avx(auVar62,auVar63);
    auVar61 = vminps_avx(auVar61,auVar62);
    uVar34 = vcmpps_avx512vl(auVar60,auVar61,2);
    if (((uint)sVar30 & 7) == 6) {
      uVar35 = vcmpps_avx512vl(auVar65,pauVar22[0xe],0xd);
      uVar15 = vcmpps_avx512vl(auVar65,pauVar22[0xf],1);
      uVar34 = uVar34 & uVar35 & uVar15;
    }
    bVar21 = (byte)uVar34;
    if (bVar21 == 0) goto LAB_01da00c5;
    auVar61 = *pauVar22;
    auVar62 = pauVar22[1];
    auVar63 = vpternlogd_avx512vl(auVar97._0_32_,auVar60,auVar98._0_32_,0xf8);
    auVar65 = vpcompressd_avx512vl(auVar63);
    auVar64._0_4_ = (uint)(bVar21 & 1) * auVar65._0_4_ | (uint)!(bool)(bVar21 & 1) * auVar63._0_4_;
    bVar32 = (bool)((byte)(uVar34 >> 1) & 1);
    auVar64._4_4_ = (uint)bVar32 * auVar65._4_4_ | (uint)!bVar32 * auVar63._4_4_;
    bVar32 = (bool)((byte)(uVar34 >> 2) & 1);
    auVar64._8_4_ = (uint)bVar32 * auVar65._8_4_ | (uint)!bVar32 * auVar63._8_4_;
    bVar32 = (bool)((byte)(uVar34 >> 3) & 1);
    auVar64._12_4_ = (uint)bVar32 * auVar65._12_4_ | (uint)!bVar32 * auVar63._12_4_;
    bVar32 = (bool)((byte)(uVar34 >> 4) & 1);
    auVar64._16_4_ = (uint)bVar32 * auVar65._16_4_ | (uint)!bVar32 * auVar63._16_4_;
    bVar32 = (bool)((byte)(uVar34 >> 5) & 1);
    auVar64._20_4_ = (uint)bVar32 * auVar65._20_4_ | (uint)!bVar32 * auVar63._20_4_;
    bVar32 = (bool)((byte)(uVar34 >> 6) & 1);
    auVar64._24_4_ = (uint)bVar32 * auVar65._24_4_ | (uint)!bVar32 * auVar63._24_4_;
    bVar32 = SUB81(uVar34 >> 7,0);
    auVar64._28_4_ = (uint)bVar32 * auVar65._28_4_ | (uint)!bVar32 * auVar63._28_4_;
    auVar63 = vpermt2q_avx512vl(auVar61,auVar64,auVar62);
    sVar30 = auVar63._0_8_;
    bVar21 = bVar21 - 1 & bVar21;
    if (bVar21 != 0) {
      auVar63 = vpshufd_avx2(auVar64,0x55);
      vpermt2q_avx512vl(auVar61,auVar63,auVar62);
      auVar65 = vpminsd_avx2(auVar64,auVar63);
      auVar63 = vpmaxsd_avx2(auVar64,auVar63);
      bVar21 = bVar21 - 1 & bVar21;
      if (bVar21 == 0) {
        auVar64 = vpermi2q_avx512vl(auVar65,auVar61,auVar62);
        sVar30 = auVar64._0_8_;
        auVar61 = vpermt2q_avx512vl(auVar61,auVar63,auVar62);
        (local_26b0->ptr).ptr = auVar61._0_8_;
        lVar23 = 8;
        lStack_26c0 = 0x10;
      }
      else {
        auVar12 = vpshufd_avx2(auVar64,0xaa);
        vpermt2q_avx512vl(auVar61,auVar12,auVar62);
        auVar67 = vpminsd_avx2(auVar65,auVar12);
        auVar65 = vpmaxsd_avx2(auVar65,auVar12);
        auVar12 = vpminsd_avx2(auVar63,auVar65);
        auVar65 = vpmaxsd_avx2(auVar63,auVar65);
        bVar21 = bVar21 - 1 & bVar21;
        if (bVar21 == 0) {
          auVar63 = vpermi2q_avx512vl(auVar67,auVar61,auVar62);
          sVar30 = auVar63._0_8_;
          auVar63 = vpermt2q_avx512vl(auVar61,auVar65,auVar62);
          (local_26b0->ptr).ptr = auVar63._0_8_;
          auVar63 = vpermd_avx2(auVar65,auVar60);
          local_26b0->dist = auVar63._0_4_;
          auVar61 = vpermt2q_avx512vl(auVar61,auVar12,auVar62);
          local_26b0[1].ptr.ptr = auVar61._0_8_;
          lStack_26c0 = 0x18;
          lVar23 = lStack_26c0;
          lStack_26c0 = 0x20;
          auVar63 = auVar12;
        }
        else {
          auVar63 = vpshufd_avx2(auVar64,0xff);
          vpermt2q_avx512vl(auVar61,auVar63,auVar62);
          auVar11 = vpminsd_avx2(auVar67,auVar63);
          auVar67 = vpmaxsd_avx2(auVar67,auVar63);
          auVar63 = vpminsd_avx2(auVar12,auVar67);
          auVar67 = vpmaxsd_avx2(auVar12,auVar67);
          auVar12 = vpminsd_avx2(auVar65,auVar67);
          auVar65 = vpmaxsd_avx2(auVar65,auVar67);
          bVar21 = bVar21 - 1 & bVar21;
          if (bVar21 != 0) {
            auVar66 = valignd_avx512vl(auVar64,auVar64,3);
            auVar64 = vpmovsxbd_avx512vl(ZEXT816(0x303020108));
            auVar67 = vpermt2d_avx512vl(ZEXT1632(CONCAT412(0x80000000,
                                                           CONCAT48(0x80000000,0x8000000080000000)))
                                        ,auVar64,auVar11);
            auVar64 = vpmovsxbd_avx2(ZEXT816(0x5040302010008));
            auVar63 = vpermt2d_avx512vl(auVar67,auVar64,auVar63);
            auVar64 = vpermt2d_avx512vl(auVar63,auVar64,auVar12);
            auVar63 = vpmovsxbd_avx2(ZEXT816(0x605040302010008));
            auVar63 = vpermt2d_avx512vl(auVar64,auVar63,auVar65);
            auVar99 = ZEXT3264(auVar63);
            bVar24 = bVar21;
            do {
              auVar64 = auVar99._0_32_;
              auVar67._8_4_ = 1;
              auVar67._0_8_ = 0x100000001;
              auVar67._12_4_ = 1;
              auVar67._16_4_ = 1;
              auVar67._20_4_ = 1;
              auVar67._24_4_ = 1;
              auVar67._28_4_ = 1;
              auVar63 = vpermd_avx2(auVar67,auVar66);
              auVar66 = valignd_avx512vl(auVar66,auVar66,1);
              vpermt2q_avx512vl(auVar61,auVar66,auVar62);
              bVar24 = bVar24 - 1 & bVar24;
              uVar16 = vpcmpd_avx512vl(auVar63,auVar64,5);
              auVar63 = vpmaxsd_avx2(auVar63,auVar64);
              bVar17 = (byte)uVar16 << 1;
              auVar64 = valignd_avx512vl(auVar64,auVar64,7);
              bVar32 = (bool)((byte)uVar16 & 1);
              bVar6 = (bool)(bVar17 >> 2 & 1);
              bVar7 = (bool)(bVar17 >> 3 & 1);
              bVar8 = (bool)(bVar17 >> 4 & 1);
              bVar9 = (bool)(bVar17 >> 5 & 1);
              bVar10 = (bool)(bVar17 >> 6 & 1);
              auVar99 = ZEXT3264(CONCAT428((uint)(bVar17 >> 7) * auVar64._28_4_ |
                                           (uint)!(bool)(bVar17 >> 7) * auVar63._28_4_,
                                           CONCAT424((uint)bVar10 * auVar64._24_4_ |
                                                     (uint)!bVar10 * auVar63._24_4_,
                                                     CONCAT420((uint)bVar9 * auVar64._20_4_ |
                                                               (uint)!bVar9 * auVar63._20_4_,
                                                               CONCAT416((uint)bVar8 *
                                                                         auVar64._16_4_ |
                                                                         (uint)!bVar8 *
                                                                         auVar63._16_4_,
                                                                         CONCAT412((uint)bVar7 *
                                                                                   auVar64._12_4_ |
                                                                                   (uint)!bVar7 *
                                                                                   auVar63._12_4_,
                                                                                   CONCAT48((uint)
                                                  bVar6 * auVar64._8_4_ |
                                                  (uint)!bVar6 * auVar63._8_4_,
                                                  CONCAT44((uint)bVar32 * auVar64._4_4_ |
                                                           (uint)!bVar32 * auVar63._4_4_,
                                                           auVar63._0_4_))))))));
            } while (bVar24 != 0);
            lVar23 = (ulong)(uint)POPCOUNT((uint)bVar21) + 3;
            while( true ) {
              auVar64 = auVar99._0_32_;
              auVar63 = vpermt2q_avx512vl(auVar61,auVar64,auVar62);
              sVar30 = auVar63._0_8_;
              bVar32 = lVar23 == 0;
              lVar23 = lVar23 + -1;
              if (bVar32) break;
              (local_26b0->ptr).ptr = sVar30;
              auVar63 = vpermd_avx2(auVar64,auVar60);
              local_26b0->dist = auVar63._0_4_;
              auVar63 = valignd_avx512vl(auVar64,auVar64,1);
              auVar99 = ZEXT3264(auVar63);
              local_26b0 = local_26b0 + 1;
            }
            auVar99 = ZEXT3264(local_24b8);
            auVar100 = ZEXT3264(local_24d8);
            auVar101 = ZEXT3264(local_24f8);
            auVar102 = ZEXT3264(local_2518);
            auVar103 = ZEXT3264(local_2538);
            auVar104 = ZEXT3264(local_2558);
            goto LAB_01da00fb;
          }
          auVar64 = vpermi2q_avx512vl(auVar11,auVar61,auVar62);
          sVar30 = auVar64._0_8_;
          auVar64 = vpermt2q_avx512vl(auVar61,auVar65,auVar62);
          (local_26b0->ptr).ptr = auVar64._0_8_;
          auVar64 = vpermd_avx2(auVar65,auVar60);
          local_26b0->dist = auVar64._0_4_;
          auVar64 = vpermt2q_avx512vl(auVar61,auVar12,auVar62);
          local_26b0[1].ptr.ptr = auVar64._0_8_;
          auVar64 = vpermd_avx2(auVar12,auVar60);
          local_26b0[1].dist = auVar64._0_4_;
          auVar61 = vpermt2q_avx512vl(auVar61,auVar63,auVar62);
          local_26b0[2].ptr.ptr = auVar61._0_8_;
          lVar23 = 0x28;
          lStack_26c0 = 0x30;
        }
      }
      auVar60 = vpermd_avx2(auVar63,auVar60);
      *(int *)((long)&(local_26b0->ptr).ptr + lVar23) = auVar60._0_4_;
      local_26b0 = (StackItemT<embree::NodeRefPtr<8>_> *)
                   ((long)&(local_26b0->ptr).ptr + lStack_26c0);
    }
  } while( true );
  local_2658 = (ulong)((uint)sVar30 & 0xf) - 8;
  uVar34 = sVar30 & 0xfffffffffffffff0;
  for (local_2650 = 0; local_2650 != local_2658; local_2650 = local_2650 + 1) {
    lVar23 = local_2650 * 0x140;
    uVar73 = *(undefined4 *)(ray + k * 4 + 0x70);
    auVar45._4_4_ = uVar73;
    auVar45._0_4_ = uVar73;
    auVar45._8_4_ = uVar73;
    auVar45._12_4_ = uVar73;
    auVar58 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar34 + 0x90 + lVar23),auVar45,
                              *(undefined1 (*) [16])(uVar34 + lVar23));
    auVar56 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar34 + 0xa0 + lVar23),auVar45,
                              *(undefined1 (*) [16])(uVar34 + 0x10 + lVar23));
    auVar57 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar34 + 0xb0 + lVar23),auVar45,
                              *(undefined1 (*) [16])(uVar34 + 0x20 + lVar23));
    auVar51 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar34 + 0xc0 + lVar23),auVar45,
                              *(undefined1 (*) [16])(uVar34 + 0x30 + lVar23));
    auVar41 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar34 + 0xd0 + lVar23),auVar45,
                              *(undefined1 (*) [16])(uVar34 + 0x40 + lVar23));
    auVar42 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar34 + 0xe0 + lVar23),auVar45,
                              *(undefined1 (*) [16])(uVar34 + 0x50 + lVar23));
    auVar43 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar34 + 0xf0 + lVar23),auVar45,
                              *(undefined1 (*) [16])(uVar34 + 0x60 + lVar23));
    auVar44 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar34 + 0x100 + lVar23),auVar45,
                              *(undefined1 (*) [16])(uVar34 + 0x70 + lVar23));
    auVar45 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar34 + 0x110 + lVar23),auVar45,
                              *(undefined1 (*) [16])(uVar34 + 0x80 + lVar23));
    uVar73 = *(undefined4 *)(ray + k * 4);
    auVar46._4_4_ = uVar73;
    auVar46._0_4_ = uVar73;
    auVar46._8_4_ = uVar73;
    auVar46._12_4_ = uVar73;
    auVar36 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x10)));
    auVar37 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x20)));
    uVar73 = *(undefined4 *)(ray + k * 4 + 0x40);
    auVar71._4_4_ = uVar73;
    auVar71._0_4_ = uVar73;
    auVar71._8_4_ = uVar73;
    auVar71._12_4_ = uVar73;
    uVar73 = *(undefined4 *)(ray + k * 4 + 0x50);
    auVar72._4_4_ = uVar73;
    auVar72._0_4_ = uVar73;
    auVar72._8_4_ = uVar73;
    auVar72._12_4_ = uVar73;
    fVar74 = *(float *)(ray + k * 4 + 0x60);
    auVar75._4_4_ = fVar74;
    auVar75._0_4_ = fVar74;
    auVar75._8_4_ = fVar74;
    auVar75._12_4_ = fVar74;
    auVar58 = vsubps_avx(auVar58,auVar46);
    auVar38 = vsubps_avx512vl(auVar56,auVar36);
    auVar39 = vsubps_avx512vl(auVar57,auVar37);
    auVar40 = vsubps_avx512vl(auVar51,auVar46);
    auVar41 = vsubps_avx512vl(auVar41,auVar36);
    auVar42 = vsubps_avx512vl(auVar42,auVar37);
    auVar43 = vsubps_avx512vl(auVar43,auVar46);
    auVar44 = vsubps_avx512vl(auVar44,auVar36);
    auVar45 = vsubps_avx512vl(auVar45,auVar37);
    auVar36 = vsubps_avx512vl(auVar43,auVar58);
    auVar37 = vsubps_avx512vl(auVar44,auVar38);
    auVar56 = vsubps_avx(auVar45,auVar39);
    auVar46 = vsubps_avx512vl(auVar58,auVar40);
    auVar47 = vsubps_avx512vl(auVar38,auVar41);
    auVar48 = vsubps_avx512vl(auVar39,auVar42);
    auVar49 = vsubps_avx512vl(auVar40,auVar43);
    auVar50 = vsubps_avx512vl(auVar41,auVar44);
    auVar57 = vsubps_avx(auVar42,auVar45);
    auVar51 = vaddps_avx512vl(auVar43,auVar58);
    auVar52 = vaddps_avx512vl(auVar44,auVar38);
    auVar53 = vaddps_avx512vl(auVar45,auVar39);
    auVar54 = vmulps_avx512vl(auVar52,auVar56);
    auVar54 = vfmsub231ps_avx512vl(auVar54,auVar37,auVar53);
    auVar53 = vmulps_avx512vl(auVar53,auVar36);
    auVar53 = vfmsub231ps_avx512vl(auVar53,auVar56,auVar51);
    auVar55._0_4_ = auVar37._0_4_ * auVar51._0_4_;
    auVar55._4_4_ = auVar37._4_4_ * auVar51._4_4_;
    auVar55._8_4_ = auVar37._8_4_ * auVar51._8_4_;
    auVar55._12_4_ = auVar37._12_4_ * auVar51._12_4_;
    auVar51 = vfmsub231ps_fma(auVar55,auVar36,auVar52);
    auVar52._0_4_ = fVar74 * auVar51._0_4_;
    auVar52._4_4_ = fVar74 * auVar51._4_4_;
    auVar52._8_4_ = fVar74 * auVar51._8_4_;
    auVar52._12_4_ = fVar74 * auVar51._12_4_;
    auVar51 = vfmadd231ps_avx512vl(auVar52,auVar72,auVar53);
    auVar52 = vfmadd231ps_avx512vl(auVar51,auVar71,auVar54);
    auVar51 = vaddps_avx512vl(auVar58,auVar40);
    auVar53 = vaddps_avx512vl(auVar38,auVar41);
    auVar54 = vaddps_avx512vl(auVar39,auVar42);
    auVar55 = vmulps_avx512vl(auVar53,auVar48);
    auVar55 = vfmsub231ps_avx512vl(auVar55,auVar47,auVar54);
    auVar54 = vmulps_avx512vl(auVar54,auVar46);
    auVar54 = vfmsub231ps_avx512vl(auVar54,auVar48,auVar51);
    auVar51 = vmulps_avx512vl(auVar51,auVar47);
    auVar51 = vfmsub231ps_avx512vl(auVar51,auVar46,auVar53);
    auVar53._0_4_ = fVar74 * auVar51._0_4_;
    auVar53._4_4_ = fVar74 * auVar51._4_4_;
    auVar53._8_4_ = fVar74 * auVar51._8_4_;
    auVar53._12_4_ = fVar74 * auVar51._12_4_;
    auVar51 = vfmadd231ps_avx512vl(auVar53,auVar72,auVar54);
    auVar53 = vfmadd231ps_avx512vl(auVar51,auVar71,auVar55);
    auVar43 = vaddps_avx512vl(auVar40,auVar43);
    auVar41 = vaddps_avx512vl(auVar41,auVar44);
    auVar44._0_4_ = auVar42._0_4_ + auVar45._0_4_;
    auVar44._4_4_ = auVar42._4_4_ + auVar45._4_4_;
    auVar44._8_4_ = auVar42._8_4_ + auVar45._8_4_;
    auVar44._12_4_ = auVar42._12_4_ + auVar45._12_4_;
    auVar51 = vmulps_avx512vl(auVar41,auVar57);
    auVar51 = vfmsub231ps_fma(auVar51,auVar50,auVar44);
    auVar42._0_4_ = auVar44._0_4_ * auVar49._0_4_;
    auVar42._4_4_ = auVar44._4_4_ * auVar49._4_4_;
    auVar42._8_4_ = auVar44._8_4_ * auVar49._8_4_;
    auVar42._12_4_ = auVar44._12_4_ * auVar49._12_4_;
    auVar42 = vfmsub231ps_avx512vl(auVar42,auVar57,auVar43);
    auVar43 = vmulps_avx512vl(auVar43,auVar50);
    auVar41 = vfmsub231ps_avx512vl(auVar43,auVar49,auVar41);
    auVar41 = vmulps_avx512vl(auVar41,auVar75);
    auVar41 = vfmadd231ps_avx512vl(auVar41,auVar72,auVar42);
    auVar42 = vfmadd231ps_avx512vl(auVar41,auVar71,auVar51);
    auVar43._0_4_ = auVar52._0_4_ + auVar53._0_4_;
    auVar43._4_4_ = auVar52._4_4_ + auVar53._4_4_;
    auVar43._8_4_ = auVar52._8_4_ + auVar53._8_4_;
    auVar43._12_4_ = auVar52._12_4_ + auVar53._12_4_;
    auVar43 = vaddps_avx512vl(auVar42,auVar43);
    auVar51._8_4_ = 0x7fffffff;
    auVar51._0_8_ = 0x7fffffff7fffffff;
    auVar51._12_4_ = 0x7fffffff;
    auVar51 = vandps_avx512vl(auVar43,auVar51);
    auVar41._8_4_ = 0x34000000;
    auVar41._0_8_ = 0x3400000034000000;
    auVar41._12_4_ = 0x34000000;
    auVar41 = vmulps_avx512vl(auVar51,auVar41);
    auVar44 = vminps_avx512vl(auVar52,auVar53);
    auVar44 = vminps_avx512vl(auVar44,auVar42);
    auVar45 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
    auVar45 = vxorps_avx512vl(auVar41,auVar45);
    uVar16 = vcmpps_avx512vl(auVar44,auVar45,5);
    auVar44 = vmaxps_avx512vl(auVar52,auVar53);
    auVar42 = vmaxps_avx512vl(auVar44,auVar42);
    uVar13 = vcmpps_avx512vl(auVar42,auVar41,2);
    bVar21 = ((byte)uVar16 | (byte)uVar13) & 0xf;
    if (bVar21 != 0) {
      auVar41 = vmulps_avx512vl(auVar47,auVar56);
      auVar42 = vmulps_avx512vl(auVar36,auVar48);
      auVar44 = vmulps_avx512vl(auVar46,auVar37);
      auVar45 = vmulps_avx512vl(auVar50,auVar48);
      auVar40 = vmulps_avx512vl(auVar46,auVar57);
      auVar54 = vmulps_avx512vl(auVar49,auVar47);
      auVar37 = vfmsub213ps_avx512vl(auVar37,auVar48,auVar41);
      auVar56 = vfmsub213ps_avx512vl(auVar56,auVar46,auVar42);
      auVar36 = vfmsub213ps_avx512vl(auVar36,auVar47,auVar44);
      auVar57 = vfmsub213ps_avx512vl(auVar57,auVar47,auVar45);
      auVar47 = vfmsub213ps_avx512vl(auVar49,auVar48,auVar40);
      auVar46 = vfmsub213ps_avx512vl(auVar50,auVar46,auVar54);
      auVar48 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar41 = vandps_avx512vl(auVar41,auVar48);
      auVar45 = vandps_avx512vl(auVar45,auVar48);
      uVar35 = vcmpps_avx512vl(auVar41,auVar45,1);
      auVar41 = vandps_avx512vl(auVar42,auVar48);
      auVar42 = vandps_avx512vl(auVar40,auVar48);
      uVar15 = vcmpps_avx512vl(auVar41,auVar42,1);
      auVar41 = vandps_avx512vl(auVar44,auVar48);
      auVar42 = vandps_avx512vl(auVar54,auVar48);
      uVar14 = vcmpps_avx512vl(auVar41,auVar42,1);
      bVar32 = (bool)((byte)uVar35 & 1);
      local_2588._0_4_ = (uint)bVar32 * auVar37._0_4_ | (uint)!bVar32 * auVar57._0_4_;
      bVar32 = (bool)((byte)(uVar35 >> 1) & 1);
      local_2588._4_4_ = (uint)bVar32 * auVar37._4_4_ | (uint)!bVar32 * auVar57._4_4_;
      bVar32 = (bool)((byte)(uVar35 >> 2) & 1);
      local_2588._8_4_ = (uint)bVar32 * auVar37._8_4_ | (uint)!bVar32 * auVar57._8_4_;
      bVar32 = (bool)((byte)(uVar35 >> 3) & 1);
      local_2588._12_4_ = (uint)bVar32 * auVar37._12_4_ | (uint)!bVar32 * auVar57._12_4_;
      bVar32 = (bool)((byte)uVar15 & 1);
      local_2578._0_4_ = (uint)bVar32 * auVar56._0_4_ | (uint)!bVar32 * auVar47._0_4_;
      bVar32 = (bool)((byte)(uVar15 >> 1) & 1);
      local_2578._4_4_ = (uint)bVar32 * auVar56._4_4_ | (uint)!bVar32 * auVar47._4_4_;
      bVar32 = (bool)((byte)(uVar15 >> 2) & 1);
      local_2578._8_4_ = (uint)bVar32 * auVar56._8_4_ | (uint)!bVar32 * auVar47._8_4_;
      bVar32 = (bool)((byte)(uVar15 >> 3) & 1);
      local_2578._12_4_ = (uint)bVar32 * auVar56._12_4_ | (uint)!bVar32 * auVar47._12_4_;
      bVar32 = (bool)((byte)uVar14 & 1);
      local_2568[0] = (float)((uint)bVar32 * auVar36._0_4_ | (uint)!bVar32 * auVar46._0_4_);
      bVar32 = (bool)((byte)(uVar14 >> 1) & 1);
      local_2568[1] = (float)((uint)bVar32 * auVar36._4_4_ | (uint)!bVar32 * auVar46._4_4_);
      bVar32 = (bool)((byte)(uVar14 >> 2) & 1);
      local_2568[2] = (float)((uint)bVar32 * auVar36._8_4_ | (uint)!bVar32 * auVar46._8_4_);
      bVar32 = (bool)((byte)(uVar14 >> 3) & 1);
      local_2568[3] = (float)((uint)bVar32 * auVar36._12_4_ | (uint)!bVar32 * auVar46._12_4_);
      auVar40._0_4_ = fVar74 * local_2568[0];
      auVar40._4_4_ = fVar74 * local_2568[1];
      auVar40._8_4_ = fVar74 * local_2568[2];
      auVar40._12_4_ = fVar74 * local_2568[3];
      auVar56 = vfmadd213ps_fma(auVar72,local_2578,auVar40);
      auVar56 = vfmadd213ps_fma(auVar71,local_2588,auVar56);
      auVar36._0_4_ = auVar56._0_4_ + auVar56._0_4_;
      auVar36._4_4_ = auVar56._4_4_ + auVar56._4_4_;
      auVar36._8_4_ = auVar56._8_4_ + auVar56._8_4_;
      auVar36._12_4_ = auVar56._12_4_ + auVar56._12_4_;
      auVar57._0_4_ = auVar39._0_4_ * local_2568[0];
      auVar57._4_4_ = auVar39._4_4_ * local_2568[1];
      auVar57._8_4_ = auVar39._8_4_ * local_2568[2];
      auVar57._12_4_ = auVar39._12_4_ * local_2568[3];
      auVar56 = vfmadd213ps_fma(auVar38,local_2578,auVar57);
      auVar56 = vfmadd213ps_fma(auVar58,local_2588,auVar56);
      auVar57 = vrcp14ps_avx512vl(auVar36);
      auVar58._8_4_ = 0x3f800000;
      auVar58._0_8_ = 0x3f8000003f800000;
      auVar58._12_4_ = 0x3f800000;
      auVar58 = vfnmadd213ps_avx512vl(auVar57,auVar36,auVar58);
      auVar58 = vfmadd132ps_fma(auVar58,auVar57,auVar57);
      uVar73 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar37._4_4_ = uVar73;
      auVar37._0_4_ = uVar73;
      auVar37._8_4_ = uVar73;
      auVar37._12_4_ = uVar73;
      auVar96 = ZEXT1664(auVar37);
      local_2598._0_4_ = auVar58._0_4_ * (auVar56._0_4_ + auVar56._0_4_);
      local_2598._4_4_ = auVar58._4_4_ * (auVar56._4_4_ + auVar56._4_4_);
      local_2598._8_4_ = auVar58._8_4_ * (auVar56._8_4_ + auVar56._8_4_);
      local_2598._12_4_ = auVar58._12_4_ * (auVar56._12_4_ + auVar56._12_4_);
      auVar70 = ZEXT1664(local_2598);
      uVar16 = vcmpps_avx512vl(local_2598,auVar37,2);
      uVar73 = *(undefined4 *)(ray + k * 4 + 0x30);
      auVar56._4_4_ = uVar73;
      auVar56._0_4_ = uVar73;
      auVar56._8_4_ = uVar73;
      auVar56._12_4_ = uVar73;
      uVar13 = vcmpps_avx512vl(local_2598,auVar56,0xd);
      bVar21 = (byte)uVar16 & (byte)uVar13 & bVar21;
      if (bVar21 != 0) {
        uVar16 = vcmpps_avx512vl(auVar36,_DAT_01f45a50,4);
        bVar21 = bVar21 & (byte)uVar16;
        uVar33 = (uint)bVar21;
        if (bVar21 != 0) {
          pSVar3 = context->scene;
          auVar38._8_4_ = 0x219392ef;
          auVar38._0_8_ = 0x219392ef219392ef;
          auVar38._12_4_ = 0x219392ef;
          uVar35 = vcmpps_avx512vl(auVar51,auVar38,5);
          auVar56 = vrcp14ps_avx512vl(auVar43);
          auVar50._8_4_ = 0x3f800000;
          auVar50._0_8_ = 0x3f8000003f800000;
          auVar50._12_4_ = 0x3f800000;
          auVar58 = vfnmadd213ps_fma(auVar43,auVar56,auVar50);
          auVar58 = vfmadd132ps_avx512vl(auVar58,auVar56,auVar56);
          fVar74 = (float)((uint)((byte)uVar35 & 1) * auVar58._0_4_);
          fVar76 = (float)((uint)((byte)(uVar35 >> 1) & 1) * auVar58._4_4_);
          fVar89 = (float)((uint)((byte)(uVar35 >> 2) & 1) * auVar58._8_4_);
          fVar82 = (float)((uint)((byte)(uVar35 >> 3) & 1) * auVar58._12_4_);
          auVar47._0_4_ = fVar74 * auVar52._0_4_;
          auVar47._4_4_ = fVar76 * auVar52._4_4_;
          auVar47._8_4_ = fVar89 * auVar52._8_4_;
          auVar47._12_4_ = fVar82 * auVar52._12_4_;
          local_25b8 = vminps_avx(auVar47,auVar50);
          auVar48._0_4_ = fVar74 * auVar53._0_4_;
          auVar48._4_4_ = fVar76 * auVar53._4_4_;
          auVar48._8_4_ = fVar89 * auVar53._8_4_;
          auVar48._12_4_ = fVar82 * auVar53._12_4_;
          local_25a8 = vminps_avx(auVar48,auVar50);
          lVar23 = lVar23 + uVar34;
          auVar49._8_4_ = 0x7f800000;
          auVar49._0_8_ = 0x7f8000007f800000;
          auVar49._12_4_ = 0x7f800000;
          auVar58 = vblendmps_avx512vl(auVar49,local_2598);
          auVar39._0_4_ =
               (uint)(bVar21 & 1) * auVar58._0_4_ | (uint)!(bool)(bVar21 & 1) * 0x7f800000;
          bVar32 = (bool)(bVar21 >> 1 & 1);
          auVar39._4_4_ = (uint)bVar32 * auVar58._4_4_ | (uint)!bVar32 * 0x7f800000;
          bVar32 = (bool)(bVar21 >> 2 & 1);
          auVar39._8_4_ = (uint)bVar32 * auVar58._8_4_ | (uint)!bVar32 * 0x7f800000;
          auVar39._12_4_ =
               (uint)(bVar21 >> 3) * auVar58._12_4_ | (uint)!(bool)(bVar21 >> 3) * 0x7f800000;
          auVar58 = vshufps_avx(auVar39,auVar39,0xb1);
          auVar58 = vminps_avx(auVar58,auVar39);
          auVar56 = vshufpd_avx(auVar58,auVar58,1);
          auVar58 = vminps_avx(auVar56,auVar58);
          uVar16 = vcmpps_avx512vl(auVar39,auVar58,0);
          if (((byte)uVar16 & bVar21) != 0) {
            bVar21 = (byte)uVar16 & bVar21;
          }
          uVar25 = 0;
          for (uVar26 = (uint)bVar21; (uVar26 & 1) == 0; uVar26 = uVar26 >> 1 | 0x80000000) {
            uVar25 = uVar25 + 1;
          }
          do {
            uVar28 = uVar25 & 0xff;
            uVar26 = *(uint *)(lVar23 + 0x120 + (ulong)uVar28 * 4);
            pGVar4 = (pSVar3->geometries).items[uVar26].ptr;
            if ((pGVar4->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
              bVar21 = ~(byte)(1 << (uVar25 & 0x1f)) & (byte)uVar33;
            }
            else {
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar4->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                uVar35 = (ulong)(uVar28 << 2);
                uVar73 = *(undefined4 *)(local_25b8 + uVar35);
                uVar2 = *(undefined4 *)(local_25a8 + uVar35);
                *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_2598 + uVar35);
                *(undefined4 *)(ray + k * 4 + 0xc0) = *(undefined4 *)(local_2588 + uVar35);
                *(undefined4 *)(ray + k * 4 + 0xd0) = *(undefined4 *)(local_2578 + uVar35);
                *(undefined4 *)(ray + k * 4 + 0xe0) = *(undefined4 *)((long)local_2568 + uVar35);
                *(undefined4 *)(ray + k * 4 + 0xf0) = uVar73;
                *(undefined4 *)(ray + k * 4 + 0x100) = uVar2;
                *(undefined4 *)(ray + k * 4 + 0x110) = *(undefined4 *)(lVar23 + 0x130 + uVar35);
                *(uint *)(ray + k * 4 + 0x120) = uVar26;
                *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                break;
              }
              uVar35 = (ulong)(uVar28 * 4);
              uVar73 = *(undefined4 *)(local_25b8 + uVar35);
              local_2458._4_4_ = uVar73;
              local_2458._0_4_ = uVar73;
              local_2458._8_4_ = uVar73;
              local_2458._12_4_ = uVar73;
              local_2448 = *(undefined4 *)(local_25a8 + uVar35);
              local_2428 = vpbroadcastd_avx512vl();
              uVar73 = *(undefined4 *)(lVar23 + 0x130 + uVar35);
              local_2438._4_4_ = uVar73;
              local_2438._0_4_ = uVar73;
              local_2438._8_4_ = uVar73;
              local_2438._12_4_ = uVar73;
              uVar73 = *(undefined4 *)(local_2588 + uVar35);
              uVar2 = *(undefined4 *)(local_2578 + uVar35);
              local_2478._4_4_ = uVar2;
              local_2478._0_4_ = uVar2;
              local_2478._8_4_ = uVar2;
              local_2478._12_4_ = uVar2;
              uVar2 = *(undefined4 *)((long)local_2568 + uVar35);
              local_2468._4_4_ = uVar2;
              local_2468._0_4_ = uVar2;
              local_2468._8_4_ = uVar2;
              local_2468._12_4_ = uVar2;
              local_2488[0] = (RTCHitN)(char)uVar73;
              local_2488[1] = (RTCHitN)(char)((uint)uVar73 >> 8);
              local_2488[2] = (RTCHitN)(char)((uint)uVar73 >> 0x10);
              local_2488[3] = (RTCHitN)(char)((uint)uVar73 >> 0x18);
              local_2488[4] = (RTCHitN)(char)uVar73;
              local_2488[5] = (RTCHitN)(char)((uint)uVar73 >> 8);
              local_2488[6] = (RTCHitN)(char)((uint)uVar73 >> 0x10);
              local_2488[7] = (RTCHitN)(char)((uint)uVar73 >> 0x18);
              local_2488[8] = (RTCHitN)(char)uVar73;
              local_2488[9] = (RTCHitN)(char)((uint)uVar73 >> 8);
              local_2488[10] = (RTCHitN)(char)((uint)uVar73 >> 0x10);
              local_2488[0xb] = (RTCHitN)(char)((uint)uVar73 >> 0x18);
              local_2488[0xc] = (RTCHitN)(char)uVar73;
              local_2488[0xd] = (RTCHitN)(char)((uint)uVar73 >> 8);
              local_2488[0xe] = (RTCHitN)(char)((uint)uVar73 >> 0x10);
              local_2488[0xf] = (RTCHitN)(char)((uint)uVar73 >> 0x18);
              uStack_2444 = local_2448;
              uStack_2440 = local_2448;
              uStack_243c = local_2448;
              vpcmpeqd_avx2(ZEXT1632(local_2458),ZEXT1632(local_2458));
              uStack_2414 = context->user->instID[0];
              local_2418 = uStack_2414;
              uStack_2410 = uStack_2414;
              uStack_240c = uStack_2414;
              uStack_2408 = context->user->instPrimID[0];
              uStack_2404 = uStack_2408;
              uStack_2400 = uStack_2408;
              uStack_23fc = uStack_2408;
              *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_2598 + uVar35);
              local_2668 = local_2498;
              args.valid = (int *)local_2668;
              args.geometryUserPtr = pGVar4->userPtr;
              args.context = context->user;
              args.hit = local_2488;
              args.N = 4;
              auVar58 = auVar70._0_16_;
              auVar56 = auVar96._0_16_;
              args.ray = (RTCRayN *)ray;
              if (pGVar4->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                (*pGVar4->intersectionFilterN)(&args);
                auVar96 = ZEXT1664(auVar56);
                auVar70 = ZEXT1664(auVar58);
                auVar104 = ZEXT3264(local_2558);
                auVar103 = ZEXT3264(local_2538);
                auVar102 = ZEXT3264(local_2518);
                auVar101 = ZEXT3264(local_24f8);
                auVar100 = ZEXT3264(local_24d8);
                auVar99 = ZEXT3264(local_24b8);
              }
              uVar35 = vptestmd_avx512vl(local_2668,local_2668);
              if ((uVar35 & 0xf) == 0) {
LAB_01da0da2:
                *(int *)(ray + k * 4 + 0x80) = auVar96._0_4_;
              }
              else {
                p_Var5 = context->args->filter;
                if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                   (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                     RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar4->field_8).field_0x2 & 0x40) != 0))))
                {
                  (*p_Var5)(&args);
                  auVar96 = ZEXT1664(auVar56);
                  auVar70 = ZEXT1664(auVar58);
                  auVar104 = ZEXT3264(local_2558);
                  auVar103 = ZEXT3264(local_2538);
                  auVar102 = ZEXT3264(local_2518);
                  auVar101 = ZEXT3264(local_24f8);
                  auVar100 = ZEXT3264(local_24d8);
                  auVar99 = ZEXT3264(local_24b8);
                }
                uVar35 = vptestmd_avx512vl(local_2668,local_2668);
                uVar35 = uVar35 & 0xf;
                bVar21 = (byte)uVar35;
                if (bVar21 == 0) goto LAB_01da0da2;
                iVar1 = *(int *)(args.hit + 4);
                iVar18 = *(int *)(args.hit + 8);
                iVar19 = *(int *)(args.hit + 0xc);
                bVar32 = (bool)((byte)(uVar35 >> 1) & 1);
                bVar6 = (bool)((byte)(uVar35 >> 2) & 1);
                bVar7 = SUB81(uVar35 >> 3,0);
                *(uint *)(args.ray + 0xc0) =
                     (uint)(bVar21 & 1) * *(int *)args.hit |
                     (uint)!(bool)(bVar21 & 1) * *(uint *)(args.ray + 0xc0);
                *(uint *)(args.ray + 0xc4) =
                     (uint)bVar32 * iVar1 | (uint)!bVar32 * *(int *)(args.ray + 0xc4);
                *(uint *)(args.ray + 200) =
                     (uint)bVar6 * iVar18 | (uint)!bVar6 * *(int *)(args.ray + 200);
                *(uint *)(args.ray + 0xcc) =
                     (uint)bVar7 * iVar19 | (uint)!bVar7 * *(int *)(args.ray + 0xcc);
                iVar1 = *(int *)(args.hit + 0x14);
                iVar18 = *(int *)(args.hit + 0x18);
                iVar19 = *(int *)(args.hit + 0x1c);
                bVar32 = (bool)((byte)(uVar35 >> 1) & 1);
                bVar6 = (bool)((byte)(uVar35 >> 2) & 1);
                bVar7 = SUB81(uVar35 >> 3,0);
                *(uint *)(args.ray + 0xd0) =
                     (uint)(bVar21 & 1) * *(int *)(args.hit + 0x10) |
                     (uint)!(bool)(bVar21 & 1) * *(uint *)(args.ray + 0xd0);
                *(uint *)(args.ray + 0xd4) =
                     (uint)bVar32 * iVar1 | (uint)!bVar32 * *(int *)(args.ray + 0xd4);
                *(uint *)(args.ray + 0xd8) =
                     (uint)bVar6 * iVar18 | (uint)!bVar6 * *(int *)(args.ray + 0xd8);
                *(uint *)(args.ray + 0xdc) =
                     (uint)bVar7 * iVar19 | (uint)!bVar7 * *(int *)(args.ray + 0xdc);
                iVar1 = *(int *)(args.hit + 0x24);
                iVar18 = *(int *)(args.hit + 0x28);
                iVar19 = *(int *)(args.hit + 0x2c);
                bVar32 = (bool)((byte)(uVar35 >> 1) & 1);
                bVar6 = (bool)((byte)(uVar35 >> 2) & 1);
                bVar7 = SUB81(uVar35 >> 3,0);
                *(uint *)(args.ray + 0xe0) =
                     (uint)(bVar21 & 1) * *(int *)(args.hit + 0x20) |
                     (uint)!(bool)(bVar21 & 1) * *(uint *)(args.ray + 0xe0);
                *(uint *)(args.ray + 0xe4) =
                     (uint)bVar32 * iVar1 | (uint)!bVar32 * *(int *)(args.ray + 0xe4);
                *(uint *)(args.ray + 0xe8) =
                     (uint)bVar6 * iVar18 | (uint)!bVar6 * *(int *)(args.ray + 0xe8);
                *(uint *)(args.ray + 0xec) =
                     (uint)bVar7 * iVar19 | (uint)!bVar7 * *(int *)(args.ray + 0xec);
                iVar1 = *(int *)(args.hit + 0x34);
                iVar18 = *(int *)(args.hit + 0x38);
                iVar19 = *(int *)(args.hit + 0x3c);
                bVar32 = (bool)((byte)(uVar35 >> 1) & 1);
                bVar6 = (bool)((byte)(uVar35 >> 2) & 1);
                bVar7 = SUB81(uVar35 >> 3,0);
                *(uint *)(args.ray + 0xf0) =
                     (uint)(bVar21 & 1) * *(int *)(args.hit + 0x30) |
                     (uint)!(bool)(bVar21 & 1) * *(uint *)(args.ray + 0xf0);
                *(uint *)(args.ray + 0xf4) =
                     (uint)bVar32 * iVar1 | (uint)!bVar32 * *(int *)(args.ray + 0xf4);
                *(uint *)(args.ray + 0xf8) =
                     (uint)bVar6 * iVar18 | (uint)!bVar6 * *(int *)(args.ray + 0xf8);
                *(uint *)(args.ray + 0xfc) =
                     (uint)bVar7 * iVar19 | (uint)!bVar7 * *(int *)(args.ray + 0xfc);
                auVar58 = *(undefined1 (*) [16])(args.ray + 0x100);
                auVar54._0_4_ =
                     (uint)(bVar21 & 1) * *(int *)(args.hit + 0x40) |
                     (uint)!(bool)(bVar21 & 1) * auVar58._0_4_;
                bVar32 = (bool)((byte)(uVar35 >> 1) & 1);
                auVar54._4_4_ =
                     (uint)bVar32 * *(int *)(args.hit + 0x44) | (uint)!bVar32 * auVar58._4_4_;
                bVar32 = (bool)((byte)(uVar35 >> 2) & 1);
                auVar54._8_4_ =
                     (uint)bVar32 * *(int *)(args.hit + 0x48) | (uint)!bVar32 * auVar58._8_4_;
                bVar32 = SUB81(uVar35 >> 3,0);
                auVar54._12_4_ =
                     (uint)bVar32 * *(int *)(args.hit + 0x4c) | (uint)!bVar32 * auVar58._12_4_;
                *(undefined1 (*) [16])(args.ray + 0x100) = auVar54;
                auVar58 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(args.hit + 0x50));
                *(undefined1 (*) [16])(args.ray + 0x110) = auVar58;
                auVar58 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(args.hit + 0x60));
                *(undefined1 (*) [16])(args.ray + 0x120) = auVar58;
                auVar58 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(args.hit + 0x70));
                *(undefined1 (*) [16])(args.ray + 0x130) = auVar58;
                auVar58 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(args.hit + 0x80));
                *(undefined1 (*) [16])(args.ray + 0x140) = auVar58;
                auVar96 = ZEXT464(*(uint *)(ray + k * 4 + 0x80));
              }
              uVar73 = auVar96._0_4_;
              auVar69._4_4_ = uVar73;
              auVar69._0_4_ = uVar73;
              auVar69._8_4_ = uVar73;
              auVar69._12_4_ = uVar73;
              uVar16 = vcmpps_avx512vl(auVar70._0_16_,auVar69,2);
              bVar21 = ~(byte)(1 << (uVar25 & 0x1f)) & (byte)uVar33 & (byte)uVar16;
            }
            uVar33 = (uint)bVar21;
            if (bVar21 == 0) break;
            auVar68._8_4_ = 0x7f800000;
            auVar68._0_8_ = 0x7f8000007f800000;
            auVar68._12_4_ = 0x7f800000;
            auVar58 = vblendmps_avx512vl(auVar68,auVar70._0_16_);
            auVar59._0_4_ =
                 (uint)(bVar21 & 1) * auVar58._0_4_ | (uint)!(bool)(bVar21 & 1) * 0x7f800000;
            bVar32 = (bool)(bVar21 >> 1 & 1);
            auVar59._4_4_ = (uint)bVar32 * auVar58._4_4_ | (uint)!bVar32 * 0x7f800000;
            bVar32 = (bool)(bVar21 >> 2 & 1);
            auVar59._8_4_ = (uint)bVar32 * auVar58._8_4_ | (uint)!bVar32 * 0x7f800000;
            auVar59._12_4_ =
                 (uint)(bVar21 >> 3) * auVar58._12_4_ | (uint)!(bool)(bVar21 >> 3) * 0x7f800000;
            auVar58 = vshufps_avx(auVar59,auVar59,0xb1);
            auVar58 = vminps_avx(auVar58,auVar59);
            auVar56 = vshufpd_avx(auVar58,auVar58,1);
            auVar58 = vminps_avx(auVar56,auVar58);
            uVar16 = vcmpps_avx512vl(auVar59,auVar58,0);
            bVar21 = (byte)uVar16 & bVar21;
            uVar26 = uVar33;
            if (bVar21 != 0) {
              uVar26 = (uint)bVar21;
            }
            uVar25 = 0;
            for (; (uVar26 & 1) == 0; uVar26 = uVar26 >> 1 | 0x80000000) {
              uVar25 = uVar25 + 1;
            }
          } while( true );
        }
      }
    }
    auVar96 = ZEXT3264(local_23f8);
    fVar74 = local_2398;
    fVar76 = fStack_2394;
    fVar77 = fStack_2390;
    fVar78 = fStack_238c;
    fVar79 = fStack_2388;
    fVar80 = fStack_2384;
    fVar81 = fStack_2380;
    fVar82 = local_23b8;
    fVar83 = fStack_23b4;
    fVar84 = fStack_23b0;
    fVar85 = fStack_23ac;
    fVar86 = fStack_23a8;
    fVar87 = fStack_23a4;
    fVar88 = fStack_23a0;
    fVar89 = local_23d8;
    fVar90 = fStack_23d4;
    fVar91 = fStack_23d0;
    fVar92 = fStack_23cc;
    fVar93 = fStack_23c8;
    fVar94 = fStack_23c4;
    fVar95 = fStack_23c0;
  }
  uVar73 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar70 = ZEXT3264(CONCAT428(uVar73,CONCAT424(uVar73,CONCAT420(uVar73,CONCAT416(uVar73,CONCAT412(
                                                  uVar73,CONCAT48(uVar73,CONCAT44(uVar73,uVar73)))))
                                               )));
  auVar60 = vpmovsxbd_avx2(ZEXT816(0x706050403020100));
  auVar97 = ZEXT3264(auVar60);
  auVar98 = ZEXT3264(CONCAT428(0xfffffff8,
                               CONCAT424(0xfffffff8,
                                         CONCAT420(0xfffffff8,
                                                   CONCAT416(0xfffffff8,
                                                             CONCAT412(0xfffffff8,
                                                                       CONCAT48(0xfffffff8,
                                                                                0xfffffff8fffffff8))
                                                            )))));
  goto LAB_01da00c5;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }